

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRenderer.cpp
# Opt level: O0

void __thiscall
myvk::ImGuiRenderer::setup_render_state
          (ImGuiRenderer *this,Ptr<CommandBuffer> *command_buffer,int fb_width,int fb_height,
          uint32_t current_frame)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  initializer_list<VkViewport> __l_00;
  element_type *peVar1;
  element_type *__a;
  element_type *pipeline_layout;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  uint in_R8D;
  float translate [2];
  float scale [2];
  VkViewport viewport;
  ImDrawData *draw_data;
  shared_ptr<myvk::Buffer> *in_stack_fffffffffffffe08;
  shared_ptr<myvk::BufferBase> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  VkIndexType in_stack_fffffffffffffe1c;
  uint32_t in_stack_fffffffffffffe20;
  VkShaderStageFlags in_stack_fffffffffffffe24;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_fffffffffffffe28;
  CommandBuffer *in_stack_fffffffffffffe30;
  CommandBuffer *this_00;
  allocator_type *in_stack_fffffffffffffe38;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_fffffffffffffe40;
  vector<VkViewport,_std::allocator<VkViewport>_> *this_01;
  iterator in_stack_fffffffffffffe48;
  size_type in_stack_fffffffffffffe50;
  pointer *ppVVar2;
  undefined8 ****local_198;
  undefined1 local_139 [73];
  undefined4 local_f0;
  undefined4 uStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  vector<VkViewport,_std::allocator<VkViewport>_> local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  allocator<std::shared_ptr<myvk::DescriptorSet>_> local_81;
  undefined8 ***local_80 [2];
  undefined1 ****local_70;
  undefined8 local_68;
  ImDrawData *local_28;
  uint local_1c;
  int local_18;
  int local_14;
  
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_28 = ImGui::GetDrawData();
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x296567);
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::GraphicsPipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffe10,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffffe08);
  CommandBuffer::CmdBindPipeline
            ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x2965b4);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2965c1);
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffe10,
             (shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffe08);
  local_68 = 1;
  local_70 = (undefined1 ****)local_80;
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSet>_> *)0x296618);
  __l._M_len = in_stack_fffffffffffffe50;
  __l._M_array = in_stack_fffffffffffffe48;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector(in_stack_fffffffffffffe40,__l,in_stack_fffffffffffffe38);
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::GraphicsPipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffe10,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffffe08);
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x296686);
  CommandBuffer::CmdBindDescriptorSets
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x2966be);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::~allocator(&local_81);
  local_198 = &local_70;
  do {
    local_198 = local_198 + -2;
    std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x296701);
  } while (local_198 != local_80);
  peVar1 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x296722);
  std::vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>::
  operator[]((vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
              *)(in_RDI + 0x68),(ulong)local_1c);
  ppVVar2 = &local_d8.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  CommandBuffer::CmdBindVertexBuffer
            (in_stack_fffffffffffffe30,(Ptr<BufferBase> *)in_stack_fffffffffffffe28,
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_stack_fffffffffffffe1c
            );
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x296778);
  __a = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x296785);
  std::vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>::
  operator[]((vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
              *)(in_RDI + 0x80),(ulong)local_1c);
  this_01 = &local_d8;
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  CommandBuffer::CmdBindIndexBuffer
            (in_stack_fffffffffffffe30,(Ptr<BufferBase> *)in_stack_fffffffffffffe28,
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_stack_fffffffffffffe1c
            );
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x2967db);
  local_f0 = 0;
  uStack_ec = 0;
  fStack_e8 = (float)local_14;
  fStack_e4 = (float)local_18;
  local_e0 = 0;
  uStack_dc = 0x3f800000;
  pipeline_layout =
       std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)0x296838);
  local_139._21_4_ = uStack_dc;
  local_139._17_4_ = local_e0;
  local_139._5_4_ = uStack_ec;
  local_139._1_4_ = local_f0;
  local_139._13_4_ = fStack_e4;
  local_139._9_4_ = fStack_e8;
  local_139._33_8_ = local_139 + 1;
  local_139._41_8_ = 1;
  this_00 = (CommandBuffer *)local_139;
  std::allocator<VkViewport>::allocator((allocator<VkViewport> *)0x29688b);
  __l_00._M_len = (size_type)ppVVar2;
  __l_00._M_array = (iterator)peVar1;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector(this_01,__l_00,(allocator_type *)__a)
  ;
  CommandBuffer::CmdSetViewport
            ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (vector<VkViewport,_std::allocator<VkViewport>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::vector<VkViewport,_std::allocator<VkViewport>_>::~vector
            ((vector<VkViewport,_std::allocator<VkViewport>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  std::allocator<VkViewport>::~allocator((allocator<VkViewport> *)local_139);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29699e);
  CommandBuffer::CmdPushConstants
            (this_00,(Ptr<PipelineLayout> *)pipeline_layout,in_stack_fffffffffffffe24,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2969d4);
  CommandBuffer::CmdPushConstants
            (this_00,(Ptr<PipelineLayout> *)pipeline_layout,in_stack_fffffffffffffe24,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10);
  return;
}

Assistant:

void ImGuiRenderer::setup_render_state(const Ptr<CommandBuffer> &command_buffer, int fb_width, int fb_height,
                                       uint32_t current_frame) const {
	ImDrawData *draw_data = ImGui::GetDrawData();

	{
		command_buffer->CmdBindPipeline(m_pipeline);
		command_buffer->CmdBindDescriptorSets({m_descriptor_set}, m_pipeline, {});
		command_buffer->CmdBindVertexBuffer(m_vertex_buffers[current_frame], 0);
		command_buffer->CmdBindIndexBuffer(m_index_buffers[current_frame], 0,
		                                   sizeof(ImDrawIdx) == 2 ? VK_INDEX_TYPE_UINT16 : VK_INDEX_TYPE_UINT32);
	}

	// Setup viewport:
	{
		VkViewport viewport;
		viewport.x = 0;
		viewport.y = 0;
		viewport.width = (float)fb_width;
		viewport.height = (float)fb_height;
		viewport.minDepth = 0.0f;
		viewport.maxDepth = 1.0f;
		command_buffer->CmdSetViewport({viewport});
	}

	// Setup scale and translation:
	// Our visible imgui space lies from draw_data->DisplayPps (top left) to
	// draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
	{
		float scale[] = {2.0f / draw_data->DisplaySize.x, 2.0f / draw_data->DisplaySize.y};
		float translate[] = {-1.0f - draw_data->DisplayPos.x * scale[0], -1.0f - draw_data->DisplayPos.y * scale[1]};
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_VERTEX_BIT, sizeof(float) * 0,
		                                 sizeof(scale), scale);
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_VERTEX_BIT, sizeof(float) * 2,
		                                 sizeof(translate), translate);
	}
}